

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_copy_union_leafrefs
              (lys_module *mod,lys_node *parent,lys_type *type,lys_type *prev_new,
              unres_schema *unres)

{
  byte bVar1;
  int iVar2;
  UNRES_ITEM *pUVar3;
  void *pvVar4;
  void *reloc;
  lys_ext_instance **pplStack_88;
  uint8_t ext_size;
  lys_ext_instance **ext;
  uint top_type;
  uint i;
  lys_type new;
  unres_schema *unres_local;
  lys_type *prev_new_local;
  lys_type *type_local;
  lys_node *parent_local;
  lys_module *mod_local;
  
  new.info.str.patterns_pcre = &unres->item;
  if (prev_new == (lys_type *)0x0) {
    ext._0_4_ = 1;
    memset(&top_type,0,0x40);
    top_type = type->base;
    unres_local = (unres_schema *)&top_type;
    new.der = (lys_tpdf *)parent;
  }
  else {
    ext._0_4_ = 0;
    unres_local = (unres_schema *)prev_new;
  }
  if (type->der == (lys_tpdf *)0x0) {
    __assert_fail("type->der",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x757,
                  "int lys_copy_union_leafrefs(struct lys_module *, struct lys_node *, struct lys_type *, struct lys_type *, struct unres_schema *)"
                 );
  }
  if (type->der->module == (lys_module *)0x0) {
    if (type->base == LY_TYPE_UNION) {
      *(int *)((long)&unres_local[1].item + 4) = (type->info).uni.has_ptr_type;
      *(uint *)&unres_local[1].item = (type->info).bits.count;
      if (*(int *)&unres_local[1].item == 0) {
        __assert_fail("prev_new->info.uni.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0x776,
                      "int lys_copy_union_leafrefs(struct lys_module *, struct lys_node *, struct lys_type *, struct lys_type *, struct unres_schema *)"
                     );
      }
      pvVar4 = calloc((ulong)*(uint *)&unres_local[1].item,0x40);
      *(void **)&unres_local->count = pvVar4;
      if (*(long *)&unres_local->count == 0) {
        ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_copy_union_leafrefs");
        return -1;
      }
      for (ext._4_4_ = 0; ext._4_4_ < *(uint *)&unres_local[1].item; ext._4_4_ = ext._4_4_ + 1) {
        iVar2 = lys_copy_union_leafrefs
                          (mod,parent,
                           (lys_type *)((long)(type->info).bits.bit + (ulong)ext._4_4_ * 0x40),
                           (lys_type *)(*(long *)&unres_local->count + (ulong)ext._4_4_ * 0x40),
                           (unres_schema *)new.info.str.patterns_pcre);
        if (iVar2 != 0) {
          return -1;
        }
      }
      unres_local->str_snode = &type->der->name;
    }
    else {
      iVar2 = lys_type_dup(mod,parent,(lys_type *)unres_local,type,0,0,
                           (unres_schema *)new.info.str.patterns_pcre);
      if (iVar2 != 0) {
        return -1;
      }
    }
  }
  else {
    bVar1 = type->ext_size;
    iVar2 = lys_ext_dup(mod->ctx,mod,type->ext,type->ext_size,unres_local,LYEXT_PAR_TYPE,
                        &stack0xffffffffffffff78,0,(unres_schema *)new.info.str.patterns_pcre);
    if (iVar2 != 0) {
      return -1;
    }
    if (unres_local->type == (UNRES_ITEM *)0x0) {
      unres_local->type = (UNRES_ITEM *)pplStack_88;
      *(byte *)((long)&unres_local->item + 5) = bVar1;
    }
    else {
      pUVar3 = (UNRES_ITEM *)
               realloc(unres_local->type,
                       (long)(int)((uint)*(byte *)((long)&unres_local->item + 5) + (uint)bVar1) << 3
                      );
      if (pUVar3 == (UNRES_ITEM *)0x0) {
        ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_copy_union_leafrefs");
        return -1;
      }
      unres_local->type = pUVar3;
      memcpy(unres_local->type + (long)(int)(uint)*(byte *)((long)&unres_local->item + 5) * 2,
             pplStack_88,(ulong)bVar1 << 3);
      free(pplStack_88);
      *(byte *)((long)&unres_local->item + 5) = *(char *)((long)&unres_local->item + 5) + bVar1;
    }
    iVar2 = lys_copy_union_leafrefs
                      (mod,parent,&type->der->type,(lys_type *)unres_local,
                       (unres_schema *)new.info.str.patterns_pcre);
    if (iVar2 != 0) {
      return -1;
    }
  }
  if ((int)ext != 0) {
    memcpy(type,unres_local,0x40);
  }
  return 0;
}

Assistant:

int
lys_copy_union_leafrefs(struct lys_module *mod, struct lys_node *parent, struct lys_type *type, struct lys_type *prev_new,
                        struct unres_schema *unres)
{
    struct lys_type new;
    unsigned int i, top_type;
    struct lys_ext_instance **ext;
    uint8_t ext_size;
    void *reloc;

    if (!prev_new) {
        /* this is the "top-level" type, meaning it is a real type and no typedef directly above */
        top_type = 1;

        memset(&new, 0, sizeof new);

        new.base = type->base;
        new.parent = (struct lys_tpdf *)parent;

        prev_new = &new;
    } else {
        /* this is not top-level type, just a type of a typedef */
        top_type = 0;
    }

    assert(type->der);
    if (type->der->module) {
        /* typedef, skip it, but keep the extensions */
        ext_size = type->ext_size;
        if (lys_ext_dup(mod->ctx, mod, type->ext, type->ext_size, prev_new, LYEXT_PAR_TYPE, &ext, 0, unres)) {
            return -1;
        }
        if (prev_new->ext) {
            reloc = realloc(prev_new->ext, (prev_new->ext_size + ext_size) * sizeof *prev_new->ext);
            LY_CHECK_ERR_RETURN(!reloc, LOGMEM(mod->ctx), -1);
            prev_new->ext = reloc;

            memcpy(prev_new->ext + prev_new->ext_size, ext, ext_size * sizeof *ext);
            free(ext);

            prev_new->ext_size += ext_size;
        } else {
            prev_new->ext = ext;
            prev_new->ext_size = ext_size;
        }

        if (lys_copy_union_leafrefs(mod, parent, &type->der->type, prev_new, unres)) {
            return -1;
        }
    } else {
        /* type, just make a deep copy */
        switch (type->base) {
        case LY_TYPE_UNION:
            prev_new->info.uni.has_ptr_type = type->info.uni.has_ptr_type;
            prev_new->info.uni.count = type->info.uni.count;
            /* this cannot be a typedef anymore */
            assert(prev_new->info.uni.count);

            prev_new->info.uni.types = calloc(prev_new->info.uni.count, sizeof *prev_new->info.uni.types);
            LY_CHECK_ERR_RETURN(!prev_new->info.uni.types, LOGMEM(mod->ctx), -1);

            for (i = 0; i < prev_new->info.uni.count; i++) {
                if (lys_copy_union_leafrefs(mod, parent, &(type->info.uni.types[i]), &(prev_new->info.uni.types[i]), unres)) {
                    return -1;
                }
            }

            prev_new->der = type->der;
            break;
        default:
            if (lys_type_dup(mod, parent, prev_new, type, 0, 0, unres)) {
                return -1;
            }
            break;
        }
    }

    if (top_type) {
        memcpy(type, prev_new, sizeof *type);
    }
    return EXIT_SUCCESS;
}